

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> * __thiscall
kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_>::operator=
          (Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *this,
          Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *other)

{
  Disposer *this_00;
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *object;
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *other_local;
  Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>_> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
  if (object != (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0) {
    Disposer::dispose<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }